

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomOneAction.cpp
# Opt level: O1

ActionResults * __thiscall GreenRoomOneAction::Go(GreenRoomOneAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *this_00;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  itemType local_a4;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == WEST) {
    local_a4 = G_ROOM_STATE;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_a4);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    if (iVar2 == NOT_WON) {
      this_00 = (ActionResults *)operator_new(0x30);
      paVar5 = &local_40.field_2;
      local_40._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"The path is blocked.\n","");
      ActionResults::ActionResults(this_00,CURRENT,&local_40);
      _Var4._M_p = local_40._M_dataplus._M_p;
      goto LAB_00116ffc;
    }
  }
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == WEST) {
    local_a4 = G_ROOM_STATE;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_a4);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    if (iVar2 == WON) {
      local_a4 = PLAYER;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_a4);
      ItemWrapper::setLocation(pIVar3,G_ROOM2_BUCKET);
      this_00 = (ActionResults *)operator_new(0x30);
      paVar5 = &local_60.field_2;
      local_60._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"You move to the green room 2","");
      ActionResults::ActionResults(this_00,G_ROOM2_BUCKET,&local_60);
      _Var4._M_p = local_60._M_dataplus._M_p;
      goto LAB_00116ffc;
    }
  }
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  this_00 = (ActionResults *)operator_new(0x30);
  if (iVar1 == EAST) {
    paVar5 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"You can\'t go back, the door is locked.","");
    ActionResults::ActionResults(this_00,CURRENT,&local_80);
    _Var4._M_p = local_80._M_dataplus._M_p;
  }
  else {
    paVar5 = &local_a0.field_2;
    local_a0._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"You can\'t go there.","");
    ActionResults::ActionResults(this_00,CURRENT,&local_a0);
    _Var4._M_p = local_a0._M_dataplus._M_p;
  }
LAB_00116ffc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar5) {
    operator_delete(_Var4._M_p);
  }
  return this_00;
}

Assistant:

ActionResults *GreenRoomOneAction::Go() {

    if (commands->getMainItem() == WEST && itemList->getValue(G_ROOM_STATE)->getLocation() == NOT_WON) {
        return new ActionResults(CURRENT, "The path is blocked.\n");
    } else if (commands->getMainItem() == WEST && itemList->getValue(G_ROOM_STATE)->getLocation() == WON){
        itemList->getValue(PLAYER)->setLocation(G_ROOM2_BUCKET);
        return new ActionResults(G_ROOM2_BUCKET, "You move to the green room 2");
    } else if (commands->getMainItem() == EAST) {
        return new ActionResults(CURRENT, "You can't go back, the door is locked.");
    }
    return new ActionResults(CURRENT,"You can't go there.");
}